

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

void xmlFreeCatalogEntry(void *payload,xmlChar *name)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlCatalogEntryPtr ret;
  xmlChar *name_local;
  void *payload_local;
  
  if ((payload != (void *)0x0) && (*(int *)((long)payload + 0x3c) != 1)) {
    if (xmlDebugCatalogs != 0) {
      if (*(long *)((long)payload + 0x20) == 0) {
        if (*(long *)((long)payload + 0x28) == 0) {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"Free catalog entry\n");
        }
        else {
          pp_Var2 = __xmlGenericError();
          p_Var1 = *pp_Var2;
          ppvVar3 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar3,"Free catalog entry %s\n",*(undefined8 *)((long)payload + 0x28));
        }
      }
      else {
        pp_Var2 = __xmlGenericError();
        p_Var1 = *pp_Var2;
        ppvVar3 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar3,"Free catalog entry %s\n",*(undefined8 *)((long)payload + 0x20));
      }
    }
    if (*(long *)((long)payload + 0x20) != 0) {
      (*xmlFree)(*(void **)((long)payload + 0x20));
    }
    if (*(long *)((long)payload + 0x28) != 0) {
      (*xmlFree)(*(void **)((long)payload + 0x28));
    }
    if (*(long *)((long)payload + 0x30) != 0) {
      (*xmlFree)(*(void **)((long)payload + 0x30));
    }
    (*xmlFree)(payload);
  }
  return;
}

Assistant:

static void
xmlFreeCatalogEntry(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr ret = (xmlCatalogEntryPtr) payload;
    if (ret == NULL)
	return;
    /*
     * Entries stored in the file hash must be deallocated
     * only by the file hash cleaner !
     */
    if (ret->dealloc == 1)
	return;

    if (xmlDebugCatalogs) {
	if (ret->name != NULL)
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry %s\n", ret->name);
	else if (ret->value != NULL)
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry %s\n", ret->value);
	else
	    xmlGenericError(xmlGenericErrorContext,
		    "Free catalog entry\n");
    }

    if (ret->name != NULL)
	xmlFree(ret->name);
    if (ret->value != NULL)
	xmlFree(ret->value);
    if (ret->URL != NULL)
	xmlFree(ret->URL);
    xmlFree(ret);
}